

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_handle_encrypted_extensions
              (ptls_t *tls,ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  uint8_t uVar1;
  st_ptls_on_extension_t *psVar2;
  ptls_key_schedule_t *ppVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  ulong uVar8;
  bool bVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *end;
  uint8_t *puVar12;
  ushort type;
  uint8_t *puVar13;
  ptls_hash_context_t **pppVar14;
  size_t sVar15;
  ptls_iovec_t pVar16;
  ptls_raw_extension_t unknown_extensions [17];
  uint8_t *local_1f0;
  byte local_1e0 [8];
  uint8_t *local_1d8;
  ulong local_1d0;
  ptls_raw_extension_t local_1c8 [17];
  
  uVar8 = message.len;
  puVar11 = message.base;
  local_1c8[0].type = 0xffff;
  local_1e0[0] = 0x20;
  local_1e0[1] = 0x20;
  local_1e0[2] = 0;
  local_1e0[3] = 0;
  local_1e0[4] = 0;
  local_1e0[5] = 0x3a;
  local_1e0[6] = 8;
  local_1e0[7] = 0;
  if (((uVar8 & 0xfffffffffffffffe) == 4) ||
     (uVar6 = (ulong)(ushort)(*(ushort *)(puVar11 + 4) << 8 | *(ushort *)(puVar11 + 4) >> 8),
     uVar8 - 6 < uVar6)) {
    iVar5 = 0x32;
  }
  else {
    puVar12 = puVar11 + 6;
    if (uVar6 == 0) {
      bVar9 = false;
      local_1f0 = (uint8_t *)0x0;
    }
    else {
      local_1d0 = uVar8;
      local_1d8 = puVar11;
      puVar13 = puVar11 + uVar6 + 6;
      bVar9 = true;
      local_1f0 = (uint8_t *)0x0;
      do {
        if ((long)puVar13 - (long)puVar12 < 2) {
          return 0x32;
        }
        uVar1 = *puVar12;
        bVar4 = puVar12[1];
        uVar7 = CONCAT11(uVar1,bVar4);
        if (uVar7 < 0x40) {
          if ((local_1e0[uVar7 >> 3] >> (uVar7 & 7) & 1) != 0) {
            return 0x2f;
          }
          local_1e0[bVar4 >> 3] = local_1e0[bVar4 >> 3] | '\x01' << (bVar4 & 7);
        }
        if ((ulong)((long)puVar13 - (long)(puVar12 + 2)) < 2) {
          return 0x32;
        }
        uVar7 = *(ushort *)(puVar12 + 2) << 8 | *(ushort *)(puVar12 + 2) >> 8;
        uVar8 = (ulong)uVar7;
        puVar11 = puVar12 + 4;
        if ((ulong)((long)puVar13 - (long)puVar11) < uVar8) {
          return 0x32;
        }
        psVar2 = tls->ctx->on_extension;
        type = CONCAT11(uVar1,bVar4);
        if ((psVar2 != (st_ptls_on_extension_t *)0x0) &&
           (pVar16.len._0_2_ = uVar7, pVar16.base = puVar11, pVar16.len._2_6_ = 0,
           iVar5 = (*psVar2->cb)(psVar2,tls,'\b',type,pVar16), iVar5 != 0)) {
          return 1;
        }
        end = puVar12 + uVar8 + 4;
        if (type < 0x2a) {
          if (type == 0) {
            if (uVar8 != 0) {
              return 0x32;
            }
            if (tls->server_name == (char *)0x0) {
              return 0x2f;
            }
            iVar5 = ptls_server_name_is_ipaddr(tls->server_name);
            if (iVar5 != 0) {
              return 0x2f;
            }
          }
          else if (type == 0x10) {
            if (uVar7 < 2) {
              return 0x32;
            }
            uVar8 = (ulong)(ushort)(*(ushort *)(puVar12 + 4) << 8 | *(ushort *)(puVar12 + 4) >> 8);
            puVar11 = puVar12 + 6;
            if ((ulong)((long)end - (long)puVar11) < uVar8) {
              return 0x32;
            }
            if (uVar8 == 0) {
              return 0x32;
            }
            puVar10 = puVar11 + uVar8;
            uVar8 = (ulong)puVar12[6];
            puVar12 = puVar12 + 7;
            if ((ulong)((long)puVar10 - (long)puVar12) < uVar8) {
              return 0x32;
            }
            if (uVar8 == 0) {
              return 0x32;
            }
            iVar5 = ptls_set_negotiated_protocol
                              (tls,(char *)puVar12,(long)(puVar11 + uVar8 + 1) - (long)puVar12);
            if (iVar5 != 0) {
              return iVar5;
            }
            if (puVar11 + uVar8 + 1 != puVar10) {
              return 0x28;
            }
            if (puVar10 != end) {
              return 0x32;
            }
          }
          else {
LAB_00117f45:
            handle_unknown_extension(tls,properties,type,puVar11,end,local_1c8);
          }
        }
        else if (type == 0x2a) {
          bVar9 = false;
          if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) == 0) {
            return 0x2f;
          }
        }
        else {
          if (type != 0xffce) goto LAB_00117f45;
          local_1f0 = puVar11;
          if (uVar7 != 0x10) {
            return 0x2f;
          }
        }
        puVar12 = end;
      } while (end != puVar13);
      bVar9 = !bVar9;
      uVar8 = local_1d0;
      puVar11 = local_1d8;
      puVar12 = puVar13;
    }
    iVar5 = 0x32;
    if (puVar12 == puVar11 + uVar8) {
      if (tls->esni == (st_ptls_esni_secret_t *)0x0) {
        if (local_1f0 != (uint8_t *)0x0) {
          return 0x2f;
        }
      }
      else {
        if (local_1f0 == (uint8_t *)0x0) {
          return 0x2f;
        }
        iVar5 = (*ptls_mem_equal)(local_1f0,tls->esni->nonce,0x10);
        if (iVar5 == 0) {
          return 0x2f;
        }
        free_esni_secret(&tls->esni,0);
      }
      bVar4 = (tls->field_20).server.pending_traffic_secret[0x28];
      if ((bVar4 & 2) != 0) {
        if (bVar9 == false) {
          (tls->field_20).server.pending_traffic_secret[0x28] = bVar4 & 0xfd;
        }
        if (properties != (ptls_handshake_properties_t *)0x0) {
          (properties->field_0).client.early_data_acceptance = bVar9 + PTLS_EARLY_DATA_REJECTED;
        }
      }
      iVar5 = report_unknown_extensions(tls,properties,local_1c8);
      if (iVar5 == 0) {
        ppVar3 = tls->key_schedule;
        if (ppVar3->num_hashes != 0) {
          pppVar14 = &ppVar3->hashes[0].ctx;
          sVar15 = 0;
          do {
            (*(*pppVar14)->update)(*pppVar14,puVar11,uVar8);
            sVar15 = sVar15 + 1;
            pppVar14 = pppVar14 + 2;
          } while (sVar15 != ppVar3->num_hashes);
        }
        bVar4 = (tls->field_0x160 & 2) >> 1;
        tls->state = (uint)bVar4 + (uint)bVar4 * 2 +
                     PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
        iVar5 = 0x202;
      }
    }
  }
  return iVar5;
}

Assistant:

static int client_handle_encrypted_extensions(ptls_t *tls, ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len, *esni = NULL;
    uint16_t type;
    ptls_raw_extension_t unknown_extensions[MAX_UNKNOWN_EXTENSIONS + 1];
    int ret, skip_early_data = 1;

    unknown_extensions[0].type = UINT16_MAX;

    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS, &type, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS, type,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (type) {
        case PTLS_EXTENSION_TYPE_SERVER_NAME:
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            if (!(tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name))) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME:
            if (end - src != PTLS_ESNI_NONCE_SIZE) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            esni = src;
            break;
        case PTLS_EXTENSION_TYPE_ALPN:
            ptls_decode_block(src, end, 2, {
                ptls_decode_open_block(src, end, 1, {
                    if (src == end) {
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                    if ((ret = ptls_set_negotiated_protocol(tls, (const char *)src, end - src)) != 0)
                        goto Exit;
                    src = end;
                });
                if (src != end) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
            });
            break;
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if (!tls->client.using_early_data) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            skip_early_data = 0;
            break;
        default:
            handle_unknown_extension(tls, properties, type, src, end, unknown_extensions);
            break;
        }
        src = end;
    });

    if (tls->esni != NULL) {
        if (esni == NULL || !ptls_mem_equal(esni, tls->esni->nonce, PTLS_ESNI_NONCE_SIZE)) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        free_esni_secret(&tls->esni, 0);
    } else {
        if (esni != NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    if (tls->client.using_early_data) {
        if (skip_early_data)
            tls->client.using_early_data = 0;
        if (properties != NULL)
            properties->client.early_data_acceptance = skip_early_data ? PTLS_EARLY_DATA_REJECTED : PTLS_EARLY_DATA_ACCEPTED;
    }
    if ((ret = report_unknown_extensions(tls, properties, unknown_extensions)) != 0)
        goto Exit;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    tls->state =
        tls->is_psk_handshake ? PTLS_STATE_CLIENT_EXPECT_FINISHED : PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    return ret;
}